

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3f>
               (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *src,
               vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  uint *puVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  const_reference pvVar10;
  reference ppVar11;
  reference __dest;
  float eps;
  pair<const_unsigned_int,_tinyusdz::value::matrix3f> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
  *__range3;
  undefined4 local_78;
  value_type local_74;
  ulong uStack_70;
  uint32_t vidx;
  size_t i;
  undefined1 local_60 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *dst_local;
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *src_local;
  
  if (dst == (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket = (__node_base_ptr)faceVertexIndices;
    sVar4 = ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
            size(src);
    sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       vdata._M_h._M_single_bucket);
    if (sVar4 == sVar5) {
      sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         vdata._M_h._M_single_bucket);
      if (sVar4 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
        ::unordered_map((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                         *)local_60);
        i._4_4_ = 0;
        for (uStack_70 = 0; uVar1 = uStack_70,
            sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               vdata._M_h._M_single_bucket), uVar1 < sVar4;
            uStack_70 = uStack_70 + 1) {
          pvVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              vdata._M_h._M_single_bucket,uStack_70);
          local_74 = *pvVar6;
          puVar7 = ::std::max<unsigned_int>(&local_74,(uint *)((long)&i + 4));
          i._4_4_ = *puVar7;
          sVar8 = ::std::
                  unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                  ::count((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                           *)local_60,&local_74);
          if (sVar8 == 0) {
            pvVar10 = ::std::
                      vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                      ::operator[](src,uStack_70);
            pmVar9 = ::std::
                     unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                     ::operator[]((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                                   *)local_60,&local_74);
            memcpy(pmVar9,pvVar10,0x24);
          }
          else {
            pmVar9 = ::std::
                     unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                     ::operator[]((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                                   *)local_60,&local_74);
            pvVar10 = ::std::
                      vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                      ::operator[](src,uStack_70);
            eps = ::std::numeric_limits<float>::epsilon();
            bVar2 = tinyusdz::is_close(pmVar9,pvVar10,eps);
            if (!bVar2) {
              src_local._7_1_ = false;
              goto LAB_00501fb4;
            }
          }
        }
        uVar3 = i._4_4_ + 1;
        tinyusdz::value::matrix3f::identity();
        ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::assign
                  (dst,(ulong)uVar3,(value_type *)((long)&__range3 + 4));
        __end0 = ::std::
                 unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                 ::begin((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                          *)local_60);
        v = (pair<const_unsigned_int,_tinyusdz::value::matrix3f> *)
            ::std::
            unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
            ::end((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                   *)local_60);
        while (bVar2 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_false>
                                    *)&v), bVar2) {
          ppVar11 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_false,_false>
                    ::operator*(&__end0);
          __dest = ::std::
                   vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
                   operator[](dst,(ulong)ppVar11->first);
          memcpy(__dest,&ppVar11->second,0x24);
          ::std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_false,_false>::
          operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_00501fb4:
        local_78 = 1;
        ::std::
        unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
                          *)local_60);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexMat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->assign(max_vidx + 1, T::identity());

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}